

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::~SimpSolver(SimpSolver *this)

{
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_00138ca8;
  vec<Minisat::Lit>::~vec(&this->merge_count_cls);
  vec<char>::~vec(&this->eliminated);
  vec<char>::~vec(&this->frozen);
  vec<unsigned_int>::~vec(&(this->subsumption_queue).buf);
  Heap<Minisat::SimpSolver::ElimLt>::~Heap(&this->elim_heap);
  vec<int>::~vec(&this->n_occ);
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::~OccLists
            (&this->occurs);
  vec<char>::~vec(&this->touched);
  vec<unsigned_int>::~vec(&this->elimclauses);
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

SimpSolver::~SimpSolver() {}